

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArgumentParser.hpp
# Opt level: O0

string * __thiscall
Utils::ArgumentParser::get_message_abi_cxx11_(string *__return_storage_ptr__,ArgumentParser *this)

{
  bool bVar1;
  string *__rhs;
  reference ppVVar2;
  reference ppAVar3;
  string local_1b0;
  string local_190 [32];
  ArgFlag *local_170;
  ArgFlag *i_3;
  const_iterator __end1_3;
  const_iterator __begin1_3;
  vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_> *__range1_3;
  ValueArgObj *local_130;
  ValueArgObj *i_2;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_> *__range1_2;
  ValueArgObj *local_f0;
  ValueArgObj *i_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_> *__range1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ArgObject *local_50;
  ValueArgObj *i;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_> *__range1;
  ArgumentParser *this_local;
  string *message;
  
  std::operator+(__return_storage_ptr__,"Usage: ",&this->program_name);
  bVar1 = std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::empty
                    (&this->options);
  if ((!bVar1) ||
     (bVar1 = std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::empty(&this->flags),
     !bVar1)) {
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__," {OPTIONS}");
  }
  __end1 = std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::begin
                     (&this->positionals);
  i = (ValueArgObj *)
      std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::end
                (&this->positionals);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
                                     *)&i), bVar1) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
              ::operator*(&__end1);
    local_50 = &(*ppVVar2)->super_ArgObject;
    __rhs = ArgObject::get_name_abi_cxx11_(local_50);
    std::operator+(&local_90," [",__rhs);
    std::operator+(&local_70,&local_90,"]");
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    __gnu_cxx::
    __normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
    ::operator++(&__end1);
  }
  wrap_string((string *)&__range1_1,&this->short_text,0,0x50);
  std::operator+(&local_b0,"\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&__range1_1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&__range1_1);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\nOptions:\n");
  __end1_1 = std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::begin
                       (&this->positionals);
  i_1 = (ValueArgObj *)
        std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::end
                  (&this->positionals);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
                             *)&i_1), bVar1) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
              ::operator*(&__end1_1);
    local_f0 = *ppVVar2;
    (*(local_f0->super_ArgObject)._vptr_ArgObject[2])(&__range1_2);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1_2);
    std::__cxx11::string::~string((string *)&__range1_2);
    __gnu_cxx::
    __normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::begin
                       (&this->options);
  i_2 = (ValueArgObj *)
        std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>::end
                  (&this->options);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
                             *)&i_2), bVar1) {
    ppVVar2 = __gnu_cxx::
              __normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
              ::operator*(&__end1_2);
    local_130 = *ppVVar2;
    (*(local_130->super_ArgObject)._vptr_ArgObject[2])(&__range1_3);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&__range1_3);
    std::__cxx11::string::~string((string *)&__range1_3);
    __gnu_cxx::
    __normal_iterator<Utils::ValueArgObj_*const_*,_std::vector<Utils::ValueArgObj_*,_std::allocator<Utils::ValueArgObj_*>_>_>
    ::operator++(&__end1_2);
  }
  __end1_3 = std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::begin(&this->flags);
  i_3 = (ArgFlag *)
        std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>::end(&this->flags);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<Utils::ArgFlag_*const_*,_std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>_>
                             *)&i_3), bVar1) {
    ppAVar3 = __gnu_cxx::
              __normal_iterator<Utils::ArgFlag_*const_*,_std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>_>
              ::operator*(&__end1_3);
    local_170 = *ppAVar3;
    (*(local_170->super_ArgObject)._vptr_ArgObject[2])(local_190);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_190);
    std::__cxx11::string::~string(local_190);
    __gnu_cxx::
    __normal_iterator<Utils::ArgFlag_*const_*,_std::vector<Utils::ArgFlag_*,_std::allocator<Utils::ArgFlag_*>_>_>
    ::operator++(&__end1_3);
  }
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"\n");
  wrap_string(&local_1b0,&this->long_text,0,0x50);
  std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return __return_storage_ptr__;
}

Assistant:

inline std::string ArgumentParser::get_message() const {

    std::string message("Usage: "+program_name);
    if  ( !options.empty() || !flags.empty() ) message+=" {OPTIONS}";
    for (auto i : positionals)                 message+=" ["+i->get_name()+"]";

    message += "\n" + wrap_string(short_text,0,80);
    message += "\nOptions:\n";

    for (auto i : positionals) { message += i->get_message(); }
    for (auto i : options)     { message += i->get_message(); }
    for (auto i : flags)       { message += i->get_message(); }

    message+= "\n";
    message += wrap_string(long_text,0,80);
    return message;
}